

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_OneSidedShutdown_Test::SSLVersionTest_OneSidedShutdown_Test
          (SSLVersionTest_OneSidedShutdown_Test *this)

{
  SSLVersionTest_OneSidedShutdown_Test *this_local;
  
  SSLVersionTest::SSLVersionTest(&this->super_SSLVersionTest);
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_Test._vptr_Test = (_func_int **)&PTR__SSLVersionTest_OneSidedShutdown_Test_00643358;
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&DAT_00643398;
  return;
}

Assistant:

TEST_P(SSLVersionTest, OneSidedShutdown) {
  // SSL_shutdown is a no-op in DTLS.
  if (is_dtls()) {
    return;
  }
  ASSERT_TRUE(Connect());

  // Shut down half the connection. |SSL_shutdown| will return 0 to signal only
  // one side has shut down.
  ASSERT_EQ(SSL_shutdown(client_.get()), 0);

  // Reading from the server should consume the EOF.
  uint8_t byte;
  ASSERT_EQ(SSL_read(server_.get(), &byte, 1), 0);
  ASSERT_EQ(SSL_get_error(server_.get(), 0), SSL_ERROR_ZERO_RETURN);

  // However, the server may continue to write data and then shut down the
  // connection.
  byte = 42;
  ASSERT_EQ(SSL_write(server_.get(), &byte, 1), 1);
  ASSERT_EQ(SSL_read(client_.get(), &byte, 1), 1);
  ASSERT_EQ(byte, 42);

  // The server may then shutdown the connection.
  EXPECT_EQ(SSL_shutdown(server_.get()), 1);
  EXPECT_EQ(SSL_shutdown(client_.get()), 1);
}